

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HarrisCorner.cpp
# Opt level: O2

void localMaxima(Mat *cNorm,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners,
                int threshold)

{
  long *plVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  int i_1;
  int iVar9;
  int j;
  long lVar10;
  float *pfVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int i;
  int j_1;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  long local_220;
  undefined8 local_1f8;
  Mat cThreshold;
  int local_1e8;
  int local_1e4;
  long local_1e0;
  long *local_1a8;
  value_type local_190 [12];
  
  local_1f8 = CONCAT44((int)**(undefined8 **)(cNorm + 0x40),
                       (int)((ulong)**(undefined8 **)(cNorm + 0x40) >> 0x20));
  cv::Mat::zeros(local_190,&local_1f8,5);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&cThreshold);
  cv::MatExpr::~MatExpr((MatExpr *)local_190);
  uVar5 = 0;
  uVar3 = *(uint *)(cNorm + 0xc);
  if ((int)*(uint *)(cNorm + 0xc) < 1) {
    uVar3 = 0;
  }
  uVar4 = *(uint *)(cNorm + 8);
  if ((int)*(uint *)(cNorm + 8) < 1) {
    uVar4 = 0;
  }
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    lVar7 = *(long *)(cNorm + 0x10);
    plVar1 = *(long **)(cNorm + 0x48);
    lVar10 = local_1e0;
    uVar13 = (ulong)uVar3;
    while (bVar19 = uVar13 != 0, uVar13 = uVar13 - 1, bVar19) {
      fVar20 = *(float *)(lVar7 + *plVar1 * uVar5);
      if ((float)threshold <= fVar20) {
        *(float *)(lVar10 + *local_1a8 * uVar5) = fVar20;
      }
      lVar10 = lVar10 + 4;
      lVar7 = lVar7 + 4;
    }
  }
  lVar7 = 1;
  local_220 = 0;
  do {
    if ((long)local_1e8 + -2 <= lVar7) {
      for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
        for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
          fVar20 = *(float *)(*local_1a8 * uVar5 + local_1e0 + uVar13 * 4);
          if ((fVar20 != 0.0) || (NAN(fVar20))) {
            local_190[0].pt.x = (float)(int)uVar13;
            local_190[0].size = 5.0;
            local_190[0].angle = -1.0;
            local_190[0].octave = 0;
            local_190[0].class_id = -1;
            local_190[0].pt.y = (float)(int)uVar5;
            local_190[0].response = fVar20;
            std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::push_back(corners,local_190);
          }
        }
      }
      cv::Mat::~Mat(&cThreshold);
      return;
    }
    lVar17 = 0;
    lVar16 = local_1e0;
    for (lVar10 = 1; lVar10 < (long)local_1e4 + -2; lVar10 = lVar10 + 1) {
      lVar2 = *local_1a8;
      pfVar8 = (float *)(local_220 * lVar2 + lVar16);
      fVar20 = 0.0;
      uVar5 = 0xffffffffffffffff;
      iVar9 = -1;
      for (lVar14 = -1; lVar14 != 2; lVar14 = lVar14 + 1) {
        iVar18 = (int)lVar14 + (int)lVar7;
        pfVar6 = pfVar8;
        for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
          fVar21 = *pfVar6;
          pfVar11 = pfVar6;
          if (((fVar21 == 0.0) && (!NAN(fVar21))) || (fVar21 < fVar20)) {
LAB_0010613b:
            *pfVar11 = 0.0;
            fVar21 = fVar20;
          }
          else {
            if (iVar9 != -1) {
              iVar12 = (int)uVar5;
              uVar5 = lVar17 + lVar15 & 0xffffffff;
              pfVar11 = (float *)(iVar9 * lVar2 + local_1e0 + (long)iVar12 * 4);
              fVar20 = fVar21;
              iVar9 = iVar18;
              goto LAB_0010613b;
            }
            uVar5 = lVar17 + lVar15 & 0xffffffff;
            iVar9 = iVar18;
          }
          pfVar6 = pfVar6 + 1;
          fVar20 = fVar21;
        }
        pfVar8 = (float *)((long)pfVar8 + lVar2);
      }
      lVar16 = lVar16 + 4;
      lVar17 = lVar17 + 1;
    }
    lVar7 = lVar7 + 1;
    local_220 = local_220 + 1;
  } while( true );
}

Assistant:

void localMaxima(const cv::Mat& cNorm, std::vector<KeyPoint>& corners, int threshold) {

	Mat cThreshold = Mat::zeros(cNorm.size(), CV_32F);

	int rows = cNorm.rows;
	int cols = cNorm.cols;
	for (int i = 0; i < rows; ++i) {
		for (int j = 0; j < cols; ++j) {
			float intensity = cNorm.at<float>(i, j);
			if (intensity >= threshold) {
				cThreshold.at<float>(i, j) = intensity;
			}
		}
	}

	for (int i = 1; i < cThreshold.rows - 2; ++i) {
		for (int j = 1; j < cThreshold.cols - 2; ++j) {
			//loop within 3*3 box
			float max = 0;
			int row=-1, col=-1;
			for (int m = -1; m < 2; ++m) {
				for (int n = -1; n < 2; ++n) {
					float current = cThreshold.at<float>(i+m, j+n);
					if (current!=0 && current >= max) {
						max = current;
						//set previous max to 0
						if (row != -1) cThreshold.at<float>(row, col) = 0.0F;
						row = i + m;
						col = j + n;
					}
					else {
						cThreshold.at<float>(i+m,j+n) = 0.0F;
					}
				}
			}

		}
	}

	for (int i = 0; i < rows; ++i) {
		for (int j = 0; j < cols; ++j) {
			float intensity = cThreshold.at<float>(i, j);
			if (intensity != 0) {
				KeyPoint kPoint(Point(j, i), 5, -1.0F, intensity);
				corners.push_back(kPoint);
			}
		}
	}

}